

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenu(char *label,bool enabled)

{
  uint uVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiPopupData *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  ImU32 col;
  undefined7 extraout_var;
  byte bVar10;
  byte bVar11;
  undefined7 in_register_00000031;
  byte bVar12;
  uint uVar13;
  ImGuiWindow *this_00;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ImRect IVar20;
  ImGuiID id;
  uint local_b8;
  uint local_b4;
  ImVec2 ta;
  ImVec2 local_94;
  float local_8c;
  undefined1 local_88 [16];
  ImGuiWindow *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImGuiWindow **local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_88._0_4_ = (int)CONCAT71(in_register_00000031,enabled);
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    bVar6 = IsPopupOpen(id,0);
    uVar1 = this->Flags;
    bVar7 = ImVector<unsigned_int>::contains(&pIVar5->MenusIdSubmittedThisFrame,&id);
    if (bVar7) {
      if (!bVar6) {
        (pIVar5->NextWindowData).Flags = 0;
        goto LAB_0015f8fb;
      }
    }
    else {
      local_b8 = (uint)CONCAT71(extraout_var,bVar6);
      ImVector<unsigned_int>::push_back(&pIVar5->MenusIdSubmittedThisFrame,&id);
      IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
      if (((this->Flags & 0x4000000) == 0) &&
         (iVar2 = (pIVar5->BeginPopupStack).Size, iVar2 < (pIVar5->OpenPopupStack).Size)) {
        local_70 = pIVar5->NavWindow;
        if ((pIVar5->OpenPopupStack).Data[iVar2].OpenParentId ==
            (this->IDStack).Data[(long)(this->IDStack).Size + -1]) {
          pIVar5->NavWindow = this;
          bVar11 = 1;
        }
        else {
          bVar11 = 0;
        }
      }
      else {
        local_70 = pIVar5->NavWindow;
        bVar11 = 0;
      }
      bVar12 = local_88[0];
      local_48 = &pIVar5->NavWindow;
      local_94.x = (this->DC).CursorPos.x;
      fVar14 = (this->DC).CursorPos.y;
      local_88 = ZEXT416((uint)local_94.x);
      bVar6 = local_b8._0_1_;
      local_b4 = local_b8 & 0xff;
      if ((this->DC).LayoutType == 0) {
        local_88 = ZEXT416((uint)((local_94.x + -1.0) -
                                 (float)(int)((pIVar5->Style).ItemSpacing.x * 0.5)));
        local_58 = ZEXT416((uint)(fVar14 - (pIVar5->Style).FramePadding.y));
        local_68._8_4_ = extraout_XMM0_Dc;
        local_68._0_4_ = IVar4.x;
        local_68._4_4_ = IVar4.y;
        local_68._12_4_ = extraout_XMM0_Dd;
        local_94.y = ImGuiWindow::MenuBarHeight(this);
        local_94.y = local_94.y + (float)local_58._0_4_;
        local_94.x = (float)local_88._0_4_;
        fVar14 = (pIVar5->Style).ItemSpacing.x;
        (this->DC).CursorPos.x = (float)(int)(fVar14 * 0.5) + (this->DC).CursorPos.x;
        ta.y = (pIVar5->Style).ItemSpacing.y;
        ta.x = fVar14 + fVar14;
        PushStyleVar(0xd,&ta);
        ta.y = 0.0;
        ta.x = (float)local_68._0_4_;
        bVar6 = Selectable(label,bVar6,(uint)(bVar12 ^ 1) * 8 + 0x300001,&ta);
        PopStyleVar(1);
        (this->DC).CursorPos.x =
             (float)(int)((pIVar5->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
      }
      else {
        local_94.y = fVar14 - (pIVar5->Style).WindowPadding.y;
        local_58 = ZEXT416((uint)fVar14);
        local_8c = ImGuiMenuColumns::DeclColumns
                             (&(this->DC).MenuColumns,IVar4.x,0.0,
                              (float)(int)(pIVar5->FontSize * 1.2));
        IVar4 = GetContentRegionAvail();
        fVar14 = IVar4.x - local_8c;
        local_68 = ZEXT416(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
        ta.y = 0.0;
        ta.x = local_8c;
        bVar6 = Selectable(label,bVar6,(uint)(bVar12 ^ 1) * 8 + 0xb00001,&ta);
        col = GetColorU32((uint)(bVar12 ^ 1),1.0);
        IVar4.y = (float)local_58._0_4_ + 0.0;
        IVar4.x = (float)local_88._0_4_ +
                  pIVar5->FontSize * 0.3 + (float)local_68._0_4_ + (this->DC).MenuColumns.Pos[2];
        RenderArrow(this->DrawList,IVar4,col,1,1.0);
      }
      if (bVar12 == 0) {
        bVar7 = false;
      }
      else {
        bVar7 = ItemHoverable(&(this->DC).LastItemRect,id);
      }
      if (bVar11 != 0) {
        *local_48 = local_70;
      }
      if ((this->DC).LayoutType == 1) {
        iVar2 = (pIVar5->BeginPopupStack).Size;
        if ((iVar2 < (pIVar5->OpenPopupStack).Size) &&
           (pIVar3 = (pIVar5->OpenPopupStack).Data, pIVar3[iVar2].SourceWindow == this)) {
          this_00 = pIVar3[iVar2].Window;
        }
        else {
          this_00 = (ImGuiWindow *)0x0;
        }
        bVar9 = true;
        if (((pIVar5->HoveredWindow == this) && (this_00 != (ImGuiWindow *)0x0)) &&
           ((this->Flags & 0x400) == 0)) {
          IVar20 = ImGuiWindow::Rect(this_00);
          IVar15 = IVar20.Max;
          IVar4 = (pIVar5->IO).MousePos;
          IVar16 = (pIVar5->IO).MouseDelta;
          fVar17 = IVar4.x - IVar16.x;
          ta.y = IVar4.y - IVar16.y;
          fVar14 = (this_00->Pos).x;
          IVar16.y = IVar20.Max.y;
          local_38.x = IVar20.Max.x;
          if (fVar14 < (this->Pos).x || fVar14 == (this->Pos).x) {
            fVar14 = 0.5;
          }
          else {
            IVar16.x = IVar20.Min.x;
            fVar14 = -0.5;
            local_38.x = IVar20.Min.x;
            IVar15 = IVar16;
          }
          fVar18 = ABS(fVar17 - local_38.x) * 0.3;
          fVar19 = 30.0;
          if (fVar18 <= 30.0) {
            fVar19 = fVar18;
          }
          fVar19 = (float)(-(uint)(fVar18 < 5.0) & 0x40a00000 |
                          ~-(uint)(fVar18 < 5.0) & (uint)fVar19);
          ta.x = fVar14 + fVar17;
          fVar14 = (IVar20.Min.y - fVar19) - ta.y;
          if (fVar14 <= -100.0) {
            fVar14 = -100.0;
          }
          local_38.y = fVar14 + ta.y;
          fVar14 = (IVar15.y + fVar19) - ta.y;
          if (100.0 <= fVar14) {
            fVar14 = 100.0;
          }
          local_40.x = IVar15.x;
          local_40.y = fVar14 + ta.y;
          bVar8 = ImTriangleContainsPoint(&ta,&local_38,&local_40,&(pIVar5->IO).MousePos);
          bVar9 = !bVar8;
        }
        bVar10 = (byte)local_b8 ^ 1;
        if (((bVar7 | bVar10) == 1) || (pIVar5->HoveredWindow != this)) {
          bVar11 = 0;
        }
        else {
          bVar11 = (pIVar5->HoveredIdPreviousFrame != id && pIVar5->HoveredIdPreviousFrame != 0) &
                   bVar9;
        }
        bVar8 = (bool)(bVar6 & bVar10 & bVar7);
        if (bVar7 == false) {
          bVar9 = bVar8;
        }
        if ((byte)local_b8 != 0) {
          bVar9 = bVar8;
        }
        if (bVar6 != false) {
          bVar9 = bVar8;
        }
        if (pIVar5->NavActivateId == id) {
          bVar11 = (byte)local_b4;
          bVar9 = bVar10;
        }
        uVar13 = local_b8;
        if (((pIVar5->NavId == id) && (pIVar5->NavMoveRequest == true)) &&
           (bVar10 = bVar11, pIVar5->NavMoveDir == 1)) {
LAB_0015ff1a:
          bVar11 = bVar10;
          uVar13 = local_b8;
          NavMoveRequestCancel();
          bVar9 = 1;
        }
      }
      else {
        bVar10 = (byte)local_b8;
        if (bVar6 == false) {
          if ((byte)(bVar10 | bVar11 & bVar7 ^ 1) == 1) {
            uVar13 = local_b8;
            if ((pIVar5->NavId == id) && (pIVar5->NavMoveRequest == true)) {
              bVar11 = 0;
              bVar10 = 0;
              if (pIVar5->NavMoveDir == 3) goto LAB_0015ff1a;
              bVar9 = 0;
              goto LAB_0015ff28;
            }
            bVar9 = 0;
          }
          else {
            bVar9 = 1;
            uVar13 = 0;
          }
          bVar11 = 0;
        }
        else {
          bVar11 = bVar11 & bVar6 & bVar10;
          bVar9 = bVar11 ^ 1;
          uVar13 = (uint)(bVar10 ^ bVar11);
        }
      }
LAB_0015ff28:
      if (((bVar12 == 0) || (bVar11 != 0)) && (bVar6 = IsPopupOpen(id,0), bVar6)) {
        ClosePopupToLevel((pIVar5->BeginPopupStack).Size,true);
      }
      if ((((~bVar9 | (byte)uVar13) & 1) == 0) &&
         ((pIVar5->BeginPopupStack).Size < (pIVar5->OpenPopupStack).Size)) {
        OpenPopup(label,0);
        return false;
      }
      if ((bVar9 & 1) == 0) {
        if ((byte)uVar13 == 0) {
          (pIVar5->NextWindowData).Flags = 0;
          goto LAB_0015f8fb;
        }
      }
      else {
        OpenPopup(label,0);
      }
      ta.x = 0.0;
      ta.y = 0.0;
      SetNextWindowPos(&local_94,1,&ta);
    }
    bVar6 = BeginPopupEx(id,(uint)((uVar1 & 0x14000000) != 0) << 0x18 | 0x10080145);
  }
  else {
LAB_0015f8fb:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, 0.0f, IM_FLOOR(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(min_w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always); // Note: this is super misleading! The value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}